

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::exportTable(RBBITableBuilder *this,void *where)

{
  int iVar1;
  UBool UVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  undefined2 uVar7;
  uint index;
  undefined1 auVar8 [16];
  
  if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (*this->fTree != (RBBINode *)0x0)) {
    uVar3 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    if (((int)uVar3 < 0x8000) && (iVar1 = this->fDStates->count, iVar1 < 0x8000)) {
      *(uint *)((long)where + 4) = uVar3 * 2 + 8;
      *(int *)where = iVar1;
      *(uint *)((long)where + 8) = (uint)(this->fRB->fLookAheadHardBreak != '\0');
      UVar2 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
      if (UVar2 != '\0') {
        *(byte *)((long)where + 8) = *(byte *)((long)where + 8) | 2;
      }
      *(undefined4 *)((long)where + 0xc) = 0;
      index = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (; index < *where; index = index + 1) {
        pvVar4 = UVector::elementAt(this->fDStates,index);
        uVar5 = (ulong)(*(int *)((long)where + 4) * index);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)pvVar4 + 4);
        auVar8 = pshuflw(auVar8,auVar8,0xe8);
        *(int *)((long)where + uVar5 + 0x10) = auVar8._0_4_;
        *(undefined2 *)((long)where + uVar5 + 0x14) = *(undefined2 *)((long)pvVar4 + 0x18);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          if ((long)uVar6 < (long)*(int *)(*(long *)((long)pvVar4 + 0x28) + 8)) {
            uVar7 = *(undefined2 *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x18) + uVar6 * 4);
          }
          else {
            uVar7 = 0;
          }
          *(undefined2 *)((long)where + uVar6 * 2 + uVar5 + 0x18) = uVar7;
        }
      }
    }
    else {
      *this->fStatus = U_BRK_ERROR_START;
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::exportTable(void *where) {
    RBBIStateTable    *table = (RBBIStateTable *)where;
    uint32_t           state;
    int                col;

    if (U_FAILURE(*fStatus) || fTree == NULL) {
        return;
    }

    int32_t catCount = fRB->fSetBuilder->getNumCharCategories();
    if (catCount > 0x7fff ||
        fDStates->size() > 0x7fff) {
        *fStatus = U_BRK_INTERNAL_ERROR;
        return;
    }

    table->fRowLen    = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t) * catCount;
    table->fNumStates = fDStates->size();
    table->fFlags     = 0;
    if (fRB->fLookAheadHardBreak) {
        table->fFlags  |= RBBI_LOOKAHEAD_HARD_BREAK;
    }
    if (fRB->fSetBuilder->sawBOF()) {
        table->fFlags  |= RBBI_BOF_REQUIRED;
    }
    table->fReserved  = 0;

    for (state=0; state<table->fNumStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        RBBIStateTableRow   *row = (RBBIStateTableRow *)(table->fTableData + state*table->fRowLen);
        U_ASSERT (-32768 < sd->fAccepting && sd->fAccepting <= 32767);
        U_ASSERT (-32768 < sd->fLookAhead && sd->fLookAhead <= 32767);
        row->fAccepting = (int16_t)sd->fAccepting;
        row->fLookAhead = (int16_t)sd->fLookAhead;
        row->fTagIdx    = (int16_t)sd->fTagsIdx;
        for (col=0; col<catCount; col++) {
            row->fNextState[col] = (uint16_t)sd->fDtran->elementAti(col);
        }
    }
}